

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  undefined8 *puVar1;
  Item *pIVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  double __x;
  DataArray<int> *pDVar4;
  uint uVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  long lVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_208;
  Item *local_1d0;
  cpp_dec_float<50U,_int,_void> local_1c8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_190;
  DataArray<int> *local_188;
  long local_180;
  DataArray<int> *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  if (0 < (vecset->set).thenum) {
    local_180 = 0;
    local_190 = vecset;
    local_188 = scaleExp;
    local_178 = coScaleExp;
    local_170 = epsilon;
    do {
      pIVar2 = (local_190->set).theitem;
      iVar9 = (local_190->set).thekey[local_180].idx;
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems[6] = 0;
      local_1c8.data._M_elems[7] = 0;
      local_1c8.data._M_elems[8] = 0;
      local_1c8.data._M_elems[9] = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1c8,0.0);
      if (0 < pIVar2[iVar9].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        local_1d0 = pIVar2 + iVar9;
        lVar11 = 0;
        lVar12 = 0;
        do {
          pNVar3 = (local_1d0->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_88 = *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar11 + 0x20);
          puVar1 = (undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar11);
          local_a8 = *puVar1;
          uStack_a0 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar11 + 0x10);
          local_98 = *puVar1;
          uStack_90 = puVar1[1];
          local_80 = *(undefined4 *)((long)&(pNVar3->val).m_backend.data + lVar11 + 0x28);
          local_7c = *(undefined1 *)((long)&(pNVar3->val).m_backend.data + lVar11 + 0x2c);
          local_78 = *(undefined8 *)((long)&(pNVar3->val).m_backend.data + lVar11 + 0x30);
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_68,(soplex *)&local_a8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)local_178->data
                                     [*(int *)((long)(&((local_1d0->data).
                                                                                                                
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar11)],(int)local_178->data
                    );
          iVar7 = local_68.m_backend.prec_elem;
          fVar6 = local_68.m_backend.fpclass;
          iVar9 = local_68.m_backend.exp;
          uVar5 = local_68.m_backend.data._M_elems[0];
          cVar10 = local_68.m_backend.neg;
          if (local_68.m_backend.neg == true) {
            cVar10 = local_68.m_backend.fpclass == cpp_dec_float_finite &&
                     local_68.m_backend.data._M_elems[0] == 0;
          }
          local_168.data._M_elems[8] = local_68.m_backend.data._M_elems[9];
          local_168.data._M_elems[4] = local_68.m_backend.data._M_elems[5];
          local_168.data._M_elems[5] = local_68.m_backend.data._M_elems[6];
          local_168.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._28_5_;
          local_168.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[8]._1_3_;
          local_168.data._M_elems[0] = local_68.m_backend.data._M_elems[1];
          local_168.data._M_elems[1] = local_68.m_backend.data._M_elems[2];
          local_168.data._M_elems[2] = local_68.m_backend.data._M_elems[3];
          local_168.data._M_elems[3] = local_68.m_backend.data._M_elems[4];
          local_e8.data._M_elems[1] = local_1c8.data._M_elems[1];
          local_e8.data._M_elems[0] = local_1c8.data._M_elems[0];
          local_e8.data._M_elems[3] = local_1c8.data._M_elems[3];
          local_e8.data._M_elems[2] = local_1c8.data._M_elems[2];
          local_e8.data._M_elems[5] = local_1c8.data._M_elems[5];
          local_e8.data._M_elems[4] = local_1c8.data._M_elems[4];
          local_e8.data._M_elems[7] = local_1c8.data._M_elems[7];
          local_e8.data._M_elems[6] = local_1c8.data._M_elems[6];
          local_e8.data._M_elems[9] = local_1c8.data._M_elems[9];
          local_e8.data._M_elems[8] = local_1c8.data._M_elems[8];
          local_e8.exp = local_1c8.exp;
          local_e8.neg = local_1c8.neg;
          local_e8.fpclass = local_1c8.fpclass;
          local_e8.prec_elem = local_1c8.prec_elem;
          local_128.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
          local_128.data._M_elems._16_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 4)
          ;
          local_128.data._M_elems._24_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 6)
          ;
          local_128.data._M_elems._32_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 8)
          ;
          local_128.exp = (local_170->m_backend).exp;
          local_128.neg = (local_170->m_backend).neg;
          local_128.fpclass = (local_170->m_backend).fpclass;
          local_128.prec_elem = (local_170->m_backend).prec_elem;
          local_208.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
          local_208.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
          local_208.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
          local_208.data._M_elems[6] = local_68.m_backend.data._M_elems[6];
          local_208.data._M_elems[7] = local_68.m_backend.data._M_elems[7];
          local_208.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
          local_208.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
          local_208.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
          local_208.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
          local_208.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
          local_208.exp = local_68.m_backend.exp;
          local_208.prec_elem = local_68.m_backend.prec_elem;
          local_208.fpclass = local_68.m_backend.fpclass;
          local_208.neg = (bool)cVar10;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_208,&local_e8);
          if (((local_208.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN))
             && (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_208,&local_128), 0 < iVar8)) {
            local_1c8.data._M_elems[0] = uVar5;
            local_1c8.data._M_elems[9] = local_168.data._M_elems[8];
            local_1c8.data._M_elems[5] = local_168.data._M_elems[4];
            local_1c8.data._M_elems[6] = local_168.data._M_elems[5];
            local_1c8.data._M_elems[7] = local_168.data._M_elems[6];
            local_1c8.data._M_elems[8] =
                 (uint)(CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_) >>
                       0x20);
            local_1c8.data._M_elems[1] = local_168.data._M_elems[0];
            local_1c8.data._M_elems[2] = local_168.data._M_elems[1];
            local_1c8.data._M_elems[3] = local_168.data._M_elems[2];
            local_1c8.data._M_elems[4] = local_168.data._M_elems[3];
            local_1c8.exp = iVar9;
            local_1c8.prec_elem = iVar7;
            local_1c8.fpclass = fVar6;
            local_1c8.neg = (bool)cVar10;
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x3c;
        } while (lVar12 < (local_1d0->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      if (local_1c8.fpclass != cpp_dec_float_NaN) {
        local_208.fpclass = cpp_dec_float_finite;
        local_208.prec_elem = 10;
        local_208.data._M_elems[0] = 0;
        local_208.data._M_elems[1] = 0;
        local_208.data._M_elems[2] = 0;
        local_208.data._M_elems[3] = 0;
        local_208.data._M_elems[4] = 0;
        local_208.data._M_elems[5] = 0;
        local_208.data._M_elems[6] = 0;
        local_208.data._M_elems[7] = 0;
        local_208.data._M_elems[8] = 0;
        local_208.data._M_elems[9] = 0;
        local_208.exp = 0;
        local_208.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_1c8,&local_208);
        if (iVar9 == 0) {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1c8,1.0);
        }
      }
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems[8] = 0;
      local_168.data._M_elems[9]._0_1_ = 0;
      local_168._37_8_ = 0;
      local_208.fpclass = cpp_dec_float_finite;
      local_208.prec_elem = 10;
      local_208.data._M_elems[0] = 0;
      local_208.data._M_elems[1] = 0;
      local_208.data._M_elems[2] = 0;
      local_208.data._M_elems[3] = 0;
      local_208.data._M_elems[4] = 0;
      local_208.data._M_elems[5] = 0;
      local_208.data._M_elems[6] = 0;
      local_208.data._M_elems[7] = 0;
      local_208.data._M_elems[8] = 0;
      local_208.data._M_elems[9] = 0;
      local_208.exp = 0;
      local_208.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_208,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_168,&local_208,&local_1c8);
      __x = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                      (&local_168);
      lVar11 = local_180;
      pDVar4 = local_188;
      frexp(__x,local_188->data + local_180);
      pDVar4->data[lVar11] = pDVar4->data[lVar11] + -1;
      local_180 = lVar11 + 1;
    } while (local_180 < (local_190->set).thenum);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}